

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpegd_vdpu2.c
# Opt level: O0

MPP_RET hal_jpegd_vdpu2_wait(void *hal,HalTaskInfo *task)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  void *__ptr;
  RK_U32 height;
  RK_U32 width;
  JpegdSyntax *syntax;
  void *base;
  MppBuffer outputBuf;
  DecCbHalDone param;
  RK_U32 errinfo;
  JpegRegSet *reg_out;
  JpegdHalCtx *JpegHalCtx;
  MPP_RET ret;
  HalTaskInfo *task_local;
  void *hal_local;
  
  JpegHalCtx._4_4_ = MPP_OK;
  pvVar3 = *(void **)((long)hal + 0x18);
  param._20_4_ = 1;
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","enter\n","hal_jpegd_vdpu2_wait");
  }
  if ((((task->dec).flags.val >> 2 & 1) == 0) &&
     (JpegHalCtx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),0x10,(void *)0x0),
     JpegHalCtx._4_4_ != MPP_OK)) {
    (task->dec).flags.val = (task->dec).flags.val & 0xfffffffffffffffb | 4;
    _mpp_log_l(2,"HAL_JPEG_VDPU2","poll cmd failed %d\n","hal_jpegd_vdpu2_wait",
               (ulong)(uint)JpegHalCtx._4_4_);
  }
  if (*(long *)((long)hal + 0x88) != 0) {
    outputBuf = task;
    param.task = pvVar3;
    if ((*(uint *)((long)pvVar3 + 0xdc) >> 5 & 1) == 0) {
      if ((*(uint *)((long)pvVar3 + 0xdc) >> 0xc & 1) == 0) {
        if ((*(uint *)((long)pvVar3 + 0xdc) >> 0xd & 1) == 0) {
          if ((*(uint *)((long)pvVar3 + 0xdc) >> 6 & 1) == 0) {
            if (((*(uint *)((long)pvVar3 + 0xdc) & 1) != 0) &&
               (param._20_4_ = 0, (jpegd_debug & 8) != 0)) {
              _mpp_log_l(4,"HAL_JPEG_VDPU2","DECODE SUCCESS!",(char *)0x0);
            }
          }
          else {
            _mpp_log_l(2,"HAL_JPEG_VDPU2","IRQ BUFFER EMPTY!","hal_jpegd_vdpu2_wait");
          }
        }
        else {
          _mpp_log_l(2,"HAL_JPEG_VDPU2","IRQ TIMEOUT!","hal_jpegd_vdpu2_wait");
        }
      }
      else {
        _mpp_log_l(2,"HAL_JPEG_VDPU2","IRQ STREAM ERROR!","hal_jpegd_vdpu2_wait");
      }
    }
    else {
      _mpp_log_l(2,"HAL_JPEG_VDPU2","IRQ BUS ERROR!","hal_jpegd_vdpu2_wait");
    }
    param.regs._0_4_ = param._20_4_;
    mpp_callback_f("hal_jpegd_vdpu2_wait",*(MppCbCtx **)((long)hal + 0x88),&outputBuf);
  }
  if ((jpegd_debug & 0x10) != 0) {
    base = (void *)0x0;
    mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 8),(task->dec).output,SLOT_BUFFER,&base);
    __ptr = mpp_buffer_get_ptr_with_caller(base,"hal_jpegd_vdpu2_wait");
    snprintf(hal_jpegd_vdpu2_wait::name,0x3f,"/data/tmp/output%02d.yuv",
             (ulong)*(uint *)((long)hal + 0xa0));
    hal_jpegd_vdpu2_wait::jpg_file = (FILE *)fopen(hal_jpegd_vdpu2_wait::name,"wb+");
    if ((FILE *)hal_jpegd_vdpu2_wait::jpg_file != (FILE *)0x0) {
      pvVar4 = (task->dec).syntax.data;
      uVar1 = *(uint *)((long)pvVar4 + 0x8c8);
      iVar2 = *(int *)((long)pvVar4 + 0x8cc);
      fwrite(__ptr,(ulong)(uVar1 * iVar2 * 3 >> 1),1,(FILE *)hal_jpegd_vdpu2_wait::jpg_file);
      if ((jpegd_debug & 0x10) != 0) {
        _mpp_log_l(4,"HAL_JPEG_VDPU2","frame_%02d output YUV(%d*%d) saving to %s\n",(char *)0x0,
                   (ulong)*(uint *)((long)hal + 0xa0),(ulong)uVar1,iVar2,hal_jpegd_vdpu2_wait::name)
        ;
      }
      fclose((FILE *)hal_jpegd_vdpu2_wait::jpg_file);
      *(int *)((long)hal + 0xa0) = *(int *)((long)hal + 0xa0) + 1;
    }
  }
  memset((void *)((long)pvVar3 + 0xdc),0,4);
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","exit\n","hal_jpegd_vdpu2_wait");
  }
  return JpegHalCtx._4_4_;
}

Assistant:

MPP_RET hal_jpegd_vdpu2_wait(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    JpegdHalCtx *JpegHalCtx = (JpegdHalCtx *)hal;
    JpegRegSet *reg_out = JpegHalCtx->regs;
    RK_U32 errinfo = 1;

    jpegd_dbg_func("enter\n");
    if (task->dec.flags.parse_err)
        goto __SKIP_HARD;

    ret = mpp_dev_ioctl(JpegHalCtx->dev, MPP_DEV_CMD_POLL, NULL);
    if (ret) {
        task->dec.flags.parse_err = 1;
        mpp_err_f("poll cmd failed %d\n", ret);
    }

__SKIP_HARD:
    if (JpegHalCtx->dec_cb) {
        DecCbHalDone param;

        param.task = (void *)&task->dec;
        param.regs = (RK_U32 *)reg_out;
        if (reg_out->reg55_Interrupt.sw_dec_bus_int) {
            mpp_err_f("IRQ BUS ERROR!");
        } else if (reg_out->reg55_Interrupt.sw_dec_error_int) {
            mpp_err_f("IRQ STREAM ERROR!");
        } else if (reg_out->reg55_Interrupt.sw_dec_timeout) {
            mpp_err_f("IRQ TIMEOUT!");
        } else if (reg_out->reg55_Interrupt.sw_dec_buffer_int) {
            mpp_err_f("IRQ BUFFER EMPTY!");
        } else if (reg_out->reg55_Interrupt.sw_dec_irq) {
            errinfo = 0;
            jpegd_dbg_result("DECODE SUCCESS!");
        }
        param.hard_err = errinfo;
        mpp_callback(JpegHalCtx->dec_cb, &param);
    }

    /* debug information */
    if (jpegd_debug & JPEGD_DBG_IO) {
        static FILE *jpg_file;
        static char name[64];
        MppBuffer outputBuf = NULL;
        void *base = NULL;
        mpp_buf_slot_get_prop(JpegHalCtx->frame_slots, task->dec.output,
                              SLOT_BUFFER, &outputBuf);
        base = mpp_buffer_get_ptr(outputBuf);

        snprintf(name, sizeof(name) - 1, "/data/tmp/output%02d.yuv",
                 JpegHalCtx->output_yuv_count);
        jpg_file = fopen(name, "wb+");
        if (jpg_file) {
            JpegdSyntax *syntax = (JpegdSyntax *)task->dec.syntax.data;
            RK_U32 width = syntax->hor_stride;
            RK_U32 height = syntax->ver_stride;

            fwrite(base, width * height * 3 / 2, 1, jpg_file);
            jpegd_dbg_io("frame_%02d output YUV(%d*%d) saving to %s\n",
                         JpegHalCtx->output_yuv_count,
                         width, height, name);
            fclose(jpg_file);
            JpegHalCtx->output_yuv_count++;
        }
    }

    memset(&reg_out->reg55_Interrupt, 0, sizeof(RK_U32));

    jpegd_dbg_func("exit\n");
    return ret;
}